

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timerqueue_unittest.cpp
# Opt level: O1

void printid(void)

{
  int iVar1;
  int *in_FS_OFFSET;
  SourceFile file;
  SourceFile file_00;
  Logger local_1010;
  string local_40;
  Timestamp local_20;
  
  if (sznet::g_logLevel < 3) {
    file._8_8_ = 0x17;
    file.m_data = "timerqueue_unittest.cpp";
    sznet::Logger::Logger(&local_1010,file,0x17);
    if (6 < (uint)(((int)&local_1010 + 0xfb0) - (int)local_1010.m_impl.m_stream.m_buffer.m_cur)) {
      builtin_strncpy(local_1010.m_impl.m_stream.m_buffer.m_cur,"pid = ",6);
      local_1010.m_impl.m_stream.m_buffer.m_cur = local_1010.m_impl.m_stream.m_buffer.m_cur + 6;
    }
    sznet::CurrentThread::t_cachedTid::__tls_init();
    if (*in_FS_OFFSET == 0) {
      sznet::CurrentThread::cacheTid();
    }
    sznet::CurrentThread::t_cachedTid::__tls_init();
    sznet::LogStream::operator<<(&local_1010.m_impl.m_stream,*in_FS_OFFSET);
    sznet::Logger::~Logger(&local_1010);
  }
  if (sznet::g_logLevel < 3) {
    file_00._8_8_ = 0x17;
    file_00.m_data = "timerqueue_unittest.cpp";
    sznet::Logger::Logger(&local_1010,file_00,0x18);
    iVar1 = (int)&local_1010 + 0xfb0;
    if (4 < (uint)(iVar1 - (int)local_1010.m_impl.m_stream.m_buffer.m_cur)) {
      builtin_strncpy(local_1010.m_impl.m_stream.m_buffer.m_cur,"now ",4);
      local_1010.m_impl.m_stream.m_buffer.m_cur = local_1010.m_impl.m_stream.m_buffer.m_cur + 4;
    }
    local_20 = sznet::Timestamp::now();
    sznet::Timestamp::toFormattedString_abi_cxx11_(&local_40,&local_20,true);
    if (local_40._M_string_length <
        (ulong)(long)(iVar1 - (int)local_1010.m_impl.m_stream.m_buffer.m_cur)) {
      memcpy(local_1010.m_impl.m_stream.m_buffer.m_cur,local_40._M_dataplus._M_p,
             local_40._M_string_length);
      local_1010.m_impl.m_stream.m_buffer.m_cur =
           local_1010.m_impl.m_stream.m_buffer.m_cur + local_40._M_string_length;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    sznet::Logger::~Logger(&local_1010);
  }
  return;
}

Assistant:

void printid()
{
	LOG_INFO << "pid = " << CurrentThread::tid();
	LOG_INFO << "now " << Timestamp::now().toFormattedString();
}